

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint32_t FNV32a(void *key,int len,uint32_t seed)

{
  int i;
  uint8_t *data;
  uint32_t h;
  uint32_t seed_local;
  int len_local;
  void *key_local;
  
  h = seed ^ 0x811c9dc5;
  for (i = 0; i < len; i = i + 1) {
    h = (*(byte *)((long)key + (long)i) ^ h) * 0x1000193;
  }
  return h;
}

Assistant:

uint32_t
FNV32a(const void *key, int len, uint32_t seed)
{
  uint32_t h = seed;
  const uint8_t  *data = (const uint8_t *)key;

  h ^= UINT32_C(2166136261);
  for (int i = 0; i < len; i++) {
    h ^= data[i];
    h *= 16777619;
  }
  return h;
}